

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execution_environment_common.cpp
# Opt level: O0

LCC_API_VIRTUALIZATION_SUMMARY __thiscall
license::os::ExecutionEnvironment::virtualization(ExecutionEnvironment *this)

{
  bool bVar1;
  LCC_API_VIRTUALIZATION_DETAIL_conflict LVar2;
  undefined4 local_14;
  bool isContainer;
  LCC_API_VIRTUALIZATION_SUMMARY result;
  ExecutionEnvironment *this_local;
  
  bVar1 = is_container(this);
  if (bVar1) {
    local_14 = CONTAINER;
  }
  else {
    LVar2 = virtualization_detail(this);
    if ((LVar2 != BARE_TO_METAL) || (bVar1 = is_cloud(this), bVar1)) {
      local_14 = VM;
    }
    else {
      local_14 = NONE;
    }
  }
  return local_14;
}

Assistant:

LCC_API_VIRTUALIZATION_SUMMARY ExecutionEnvironment::virtualization() const {
	LCC_API_VIRTUALIZATION_SUMMARY result;
	bool isContainer = is_container();
	if (isContainer) {
		result = LCC_API_VIRTUALIZATION_SUMMARY::CONTAINER;
	} else if (virtualization_detail() != BARE_TO_METAL || is_cloud()) {
		result = LCC_API_VIRTUALIZATION_SUMMARY::VM;
	} else {
		result = LCC_API_VIRTUALIZATION_SUMMARY::NONE;
	}
	return result;
}